

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

double __thiscall
QHybrid::ComputeRecursively(QHybrid *this,size_t time_step,LIndex jaohI,Index lastJAI)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  undefined1 auVar5 [16];
  int iVar6;
  Index IVar7;
  PlanningUnitMADPDiscrete *pPVar8;
  JointBeliefInterface *pJVar9;
  long lVar10;
  BayesianGameIdenticalPayoff *this_00;
  long *plVar11;
  size_t nrAgents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes;
  LIndex i;
  ulong uVar12;
  E *this_01;
  Index joI;
  uint lastJAI_00;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double p;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double local_1f8;
  ulong local_1f0;
  ulong local_1e0;
  BGIP_sharedPtr bg_time_step;
  ulong local_1c0;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_178;
  BeliefIteratorGeneric it;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  sVar4 = this->_m_horizonFirstTimeSteps;
  if ((sVar4 == time_step) && (this->_m_QlastTimeSteps == (QFunctionJointBeliefInterface *)0x0)) {
    lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    pPVar8 = (PlanningUnitMADPDiscrete *)
             (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) + 0x60
                         ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
    pJVar9 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar8,jaohI);
    (**(code **)(*(long *)(&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8)) + 0x98))
              (&it,&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8));
    local_1f8 = 0.0;
    do {
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      iVar6 = (*(it._m_it)->_vptr_BeliefIteratorInterface[3])();
      uVar14 = (**(code **)(**(long **)(lVar10 + 0x330) + 0xc0))
                         (*(long **)(lVar10 + 0x330),iVar6,lastJAI);
      uVar15 = uVar14;
      (*(it._m_it)->_vptr_BeliefIteratorInterface[2])();
      iVar6 = (*(it._m_it)->_vptr_BeliefIteratorInterface[4])();
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1f8;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar15;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar14;
      auVar5 = vfmadd231sd_fma(auVar17,auVar26,auVar1);
      local_1f8 = auVar5._0_8_;
    } while ((char)iVar6 != '\0');
    (**(code **)((long)*pJVar9 + 8))(pJVar9);
    it._vptr_BeliefIteratorGeneric = (_func_int **)&PTR__BeliefIteratorGeneric_005d3870;
    if (it._m_it != (BeliefIteratorInterface *)0x0) {
      (*(it._m_it)->_vptr_BeliefIteratorInterface[1])();
    }
  }
  else {
    bg_time_step.px = (element_type *)0x0;
    bg_time_step.pn.pi_ = (sp_counted_base *)0x0;
    if (this->_m_QheurTypeFirstTS == eQBG) {
      this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      plVar11 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                              lVar10) + 0x60))
                                  (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrAgents = (**(code **)(*plVar11 + 0x30))(plVar11);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  (**(code **)(**(long **)(lVar10 + 0x30) + 0x58))();
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      nrTypes = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(lVar10 + 0x30) + 0xb8))();
      BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
                (this_00,nrAgents,nrActions,nrTypes,false);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
                ((shared_ptr<BayesianGameIdenticalPayoff> *)&it,this_00);
      boost::shared_ptr<BayesianGameIdenticalPayoff>::operator=
                (&bg_time_step,(shared_ptr<BayesianGameIdenticalPayoff> *)&it);
      boost::detail::shared_count::~shared_count((shared_count *)&it._m_it);
    }
    lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) + 0x60
                         ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
    plVar11 = *(long **)(lVar10 + 0x330);
    uVar15 = (**(code **)(*(long *)((long)plVar11 + *(long *)(*plVar11 + -0xb0)) + 0x70))
                       ((long)plVar11 + *(long *)(*plVar11 + -0xb0));
    local_1f0 = 0;
    local_1f8 = 0.0;
    while( true ) {
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      uVar14 = (**(code **)(**(long **)(lVar10 + 0x30) + 200))();
      if (uVar14 <= local_1f0) break;
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      joI = (Index)local_1f0;
      i = PlanningUnitMADPDiscrete::GetSuccessorJAOHI(pPVar8,jaohI,lastJAI,joI);
      IVar7 = Globals::CastLIndexToIndex(i);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      uVar14 = (ulong)IVar7;
      pJVar9 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(pPVar8,uVar14);
      lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
      pPVar8 = (PlanningUnitMADPDiscrete *)
               (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10) +
                           0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
      p = PlanningUnitMADPDiscrete::GetJAOHProbGivenPred(pPVar8,uVar14);
      if (1e-12 <= p) {
        if (this->_m_QheurTypeFirstTS == eQBG) {
          BayesianGameBase::SetProbability((BayesianGameBase *)bg_time_step.px,joI,p);
        }
        lastJAI_00 = 0;
        local_1c0 = 0xffefffffffffffff;
        while( true ) {
          lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10)
                               + 0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
          uVar12 = (**(code **)(**(long **)(lVar10 + 0x30) + 0x68))();
          uVar13 = (ulong)lastJAI_00;
          if (uVar12 <= uVar13) break;
          if (sVar4 == time_step) {
            auVar24._0_8_ =
                 (**(code **)((long)*this->_m_QlastTimeSteps + 0x70))
                           (this->_m_QlastTimeSteps,pJVar9,0,uVar13);
            auVar24._8_56_ = extraout_var;
            auVar18 = auVar24._0_16_;
          }
          else {
            (**(code **)(*(long *)(&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8)) + 0x98))
                      (&it,&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8));
            local_1e0 = 0;
            do {
              lVar10 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
              lVar10 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 +
                                             lVar10) + 0x60))
                                 (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar10);
              iVar6 = (*(it._m_it)->_vptr_BeliefIteratorInterface[3])();
              uVar16 = (**(code **)(**(long **)(lVar10 + 0x330) + 0xc0))
                                 (*(long **)(lVar10 + 0x330),iVar6,uVar13);
              uVar12 = uVar16;
              (*(it._m_it)->_vptr_BeliefIteratorInterface[2])();
              iVar6 = (*(it._m_it)->_vptr_BeliefIteratorInterface[4])();
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_1e0;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uVar12;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar16;
              auVar5 = vfmadd231sd_fma(auVar19,auVar27,auVar2);
              auVar21._0_8_ = auVar5._0_8_;
              local_1e0 = auVar21._0_8_;
            } while ((char)iVar6 != '\0');
            auVar25._0_8_ = ComputeRecursively(this,time_step + 1,uVar14,lastJAI_00);
            auVar25._8_56_ = extraout_var_00;
            auVar20 = auVar25._0_16_;
            it._vptr_BeliefIteratorGeneric = (_func_int **)&PTR__BeliefIteratorGeneric_005d3870;
            if (it._m_it != (BeliefIteratorInterface *)0x0) {
              (*(it._m_it)->_vptr_BeliefIteratorInterface[1])();
              auVar20._8_8_ = 0;
              auVar20._0_8_ = auVar25._0_8_;
            }
            auVar21._8_8_ = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar15;
            auVar18 = vfmadd132sd_fma(auVar20,auVar21,auVar3);
          }
          if (uVar14 < this->_m_nrJAOHinFirstTS) {
            (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_
            [(this->_m_QValuesFirstTimeSteps).super_matrix_t.size2_ * uVar14 + uVar13] =
                 auVar18._0_8_;
          }
          if (this->_m_QheurTypeFirstTS == eQBG) {
            (*((bg_time_step.px)->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                      (auVar18._0_8_,(bg_time_step.px)->_m_utilFunction,local_1f0,uVar13);
            auVar18._8_8_ = 0;
          }
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_1c0;
          lastJAI_00 = lastJAI_00 + 1;
          auVar5 = vmaxsd_avx(auVar18,auVar22);
          local_1c0 = auVar5._0_8_;
        }
        if (pJVar9 != (JointBeliefInterface *)0x0) {
          (**(code **)((long)*pJVar9 + 8))(pJVar9);
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_1f8;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_1c0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = p;
        auVar5 = vfmadd231sd_fma(auVar23,auVar28,auVar5);
        local_1f8 = auVar5._0_8_;
      }
      local_1f0 = (ulong)(joI + 1);
    }
    if (this->_m_QheurTypeFirstTS != eQPOMDP) {
      if (this->_m_QheurTypeFirstTS != eQBG) {
        this_01 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_01,"QHybrid: invalid Qheuristic for first time steps");
        __cxa_throw(this_01,&E::typeinfo,E::~E);
      }
      local_178.px = &(bg_time_step.px)->super_BayesianGameIdenticalPayoffInterface;
      local_178.pn.pi_ = bg_time_step.pn.pi_;
      if (bg_time_step.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (bg_time_step.pn.pi_)->use_count_ = (bg_time_step.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      BGIP_SolverBruteForceSearch<JointPolicyPureVector>::BGIP_SolverBruteForceSearch
                ((BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)&it,&local_178,0,1,0);
      boost::detail::shared_count::~shared_count(&local_178.pn);
      local_1f8 = BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve
                            ((BGIP_SolverBruteForceSearch<JointPolicyPureVector> *)&it);
      BayesianGameIdenticalPayoffSolver::~BayesianGameIdenticalPayoffSolver
                ((BayesianGameIdenticalPayoffSolver *)&it);
    }
    boost::detail::shared_count::~shared_count(&bg_time_step.pn);
  }
  return local_1f8;
}

Assistant:

double QHybrid::ComputeRecursively(size_t time_step,
                                   LIndex jaohI,
                                   Index lastJAI)
{
    bool last_t = false;
    if( time_step == _m_horizonFirstTimeSteps )
        last_t = true;

    // we don't have a vector-based representation, so at the last
    // time step just return the immediate reward
    if(last_t && !_m_QlastTimeSteps)
    {
        double Q=0.0;
        JointBeliefInterface* jbi =
            GetPU()->GetJointBeliefInterface(jaohI);
        BeliefIteratorGeneric it=jbi->GetIterator();
        do
        {
            double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), lastJAI);
            double prob_s = it.GetProbability();
            Q += r_s_ja * prob_s;
        } while(it.Next());
        delete jbi;
        return(Q);
    }

    BGIP_sharedPtr bg_time_step;
    if(_m_QheurTypeFirstTS==eQBG)
        bg_time_step=BGIP_sharedPtr(
            new BayesianGameIdenticalPayoff(
                GetPU()->GetNrAgents(), 
                GetPU()->GetNrActions(),
                GetPU()->GetNrObservations()));
            
    double Vpomdp = 0.0;
    double discount = GetPU()->GetDiscount();

    for(Index newJOI=0; newJOI < GetPU()->GetNrJointObservations(); newJOI++)
    {
        Index new_jaohI = CastLIndexToIndex(
            GetPU()->GetSuccessorJAOHI(jaohI, lastJAI, newJOI));

        //get the new joint belief at this time-step resulting from lastJAI, 
        //newJOI...(the true prob. dist over states for the actions and obser-
        //vations as given by the history < jaoh, lastJA, newJOI > )
        
        JointBeliefInterface* new_jbi =
            GetPU()->GetJointBeliefInterface(new_jaohI);
        double Po_ba = GetPU()->GetJAOHProbGivenPred(new_jaohI);

        // if the probability of this observation occurring is zero,
        // the belief is not defined, and don't have to consider this
        // part of the tree anymore
        if(Po_ba<PROB_PRECISION)
            continue;

        if(_m_QheurTypeFirstTS==eQBG)
            bg_time_step->SetProbability(newJOI, Po_ba);

        //for all joint actions newJA
        double maxQ = -DBL_MAX;
        for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
        {
            double Q=0.0;
            if(last_t)
                Q = _m_QlastTimeSteps->GetQ(*new_jbi, 0, newJAI);
            else
            {
                //calculate R(joah',newJA) - expected immediate reward for time_step
                double exp_imm_R = 0.0;
                BeliefIteratorGeneric it=new_jbi->GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    exp_imm_R += r_s_ja * prob_s;
                } while(it.Next());

                double exp_fut_R = ComputeRecursively(time_step+1, new_jaohI, newJAI);
                Q = exp_imm_R + discount * exp_fut_R;
            }
            if(new_jaohI<_m_nrJAOHinFirstTS)
                _m_QValuesFirstTimeSteps(new_jaohI,newJAI)=Q;
            if(Q > maxQ)
                maxQ = Q;
            if(_m_QheurTypeFirstTS==eQBG)
                bg_time_step->SetUtility(newJOI, newJAI, Q);
        }//end for newJAI
        
        //joint belief no longer needed:
        delete new_jbi;

        Vpomdp += Po_ba * maxQ;

    }//end for newJOI

    switch(_m_QheurTypeFirstTS)
    {
    case eQBG:
    {
        //solve this bayesian game, asking for only 1 solution
        int BGsolverVerbose=0;
        int nrSolutionsWanted=1;       
#if USE_BNB_SOLVER       
        BGIP_SolverBranchAndBound<JointPolicyPureVector> bgs(bg_time_step,
                                                             BGsolverVerbose,nrSolutionsWanted,
                                                             false,
                                                             BGIP_BnB::DescendingProbability,
                                                             false); // at least for boxPushing CCI was slower
#else
        BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step,BGsolverVerbose,nrSolutionsWanted);
#endif
        double Vbg = bgs.Solve();
        return(Vbg);
    }
    case eQPOMDP:
    {
        return(Vpomdp);
    }
    default:
        throw(E("QHybrid: invalid Qheuristic for first time steps"));
    }
    return(42);
}